

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

void al_set_bitmap_blender(int op,int src,int dest)

{
  int in_EDX;
  int in_ESI;
  int in_EDI;
  ALLEGRO_BITMAP *bitmap;
  int in_stack_fffffffffffffff0;
  
  al_get_target_bitmap();
  al_set_separate_bitmap_blender
            (bitmap._4_4_,(int)bitmap,in_EDI,in_ESI,in_EDX,in_stack_fffffffffffffff0);
  return;
}

Assistant:

void al_set_bitmap_blender(int op, int src, int dest)
{
   ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();

   ASSERT(bitmap);

   al_set_separate_bitmap_blender(op, src, dest, op, src, dest);
}